

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_shift_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  ulong arg2;
  TCGOpcode opc_00;
  uint arg2_00;
  TCGv_i32 ret;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  
  if (rt == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  arg2_00 = (ushort)imm & 0x1f;
  arg2 = (ulong)arg2_00;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)s);
  if (rs == 0) {
    opc_00 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_0099379b:
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else if (s->cpu_gpr[rs] != ret_00) {
    pTVar2 = s->cpu_gpr[rs] + (long)s;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_0099379b;
  }
  if ((int)opc < 0x38) {
    if (opc == 0) {
      tcg_gen_shli_i64_mips64el(s,ret_00,ret_00,arg2);
    }
    else {
      if (opc != 2) {
        if (opc != 3) goto switchD_009937cf_caseD_39;
        pTVar2 = s->cpu_gpr[rt];
        goto LAB_009938aa;
      }
      if (arg2 != 0) {
        tcg_gen_ext32u_i64_mips64el(s,ret_00,ret_00);
        pTVar2 = s->cpu_gpr[rt];
        goto LAB_00993994;
      }
    }
LAB_0099399b:
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[rt],ret_00);
    goto switchD_009937cf_caseD_39;
  }
  if (0x200001 < (int)opc) {
    if (opc != 0x200002) {
      if (opc == 0x20003a) {
        pTVar2 = s->cpu_gpr[rt];
        if ((imm & 0x1fU) == 0) {
          if (pTVar2 != ret_00) {
            tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)s),(TCGArg)pTVar1);
          }
          goto switchD_009937cf_caseD_39;
        }
      }
      else {
        if (opc != 0x20003e) goto switchD_009937cf_caseD_39;
        pTVar2 = s->cpu_gpr[rt];
        arg2_00 = arg2_00 | 0x20;
      }
      tcg_gen_rotri_i64_mips64el(s,pTVar2,ret_00,arg2_00);
      goto switchD_009937cf_caseD_39;
    }
    if (arg2 != 0) {
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      ret = (TCGv_i32)((long)pTVar1 - (long)s);
      tcg_gen_extrl_i64_i32_mips64el(s,ret,ret_00);
      tcg_gen_rotri_i32_mips64el(s,ret,ret,arg2_00);
      tcg_gen_ext_i32_i64_mips64el(s,s->cpu_gpr[rt],ret);
      tcg_temp_free_internal_mips64el(s,pTVar1);
      goto switchD_009937cf_caseD_39;
    }
    goto LAB_0099399b;
  }
  switch(opc) {
  case 0x38:
    pTVar2 = s->cpu_gpr[rt];
    break;
  default:
    goto switchD_009937cf_caseD_39;
  case 0x3a:
    pTVar2 = s->cpu_gpr[rt];
    goto LAB_00993994;
  case 0x3b:
    pTVar2 = s->cpu_gpr[rt];
    goto LAB_009938aa;
  case 0x3c:
    pTVar2 = s->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
    break;
  case 0x3e:
    pTVar2 = s->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
LAB_00993994:
    tcg_gen_shri_i64_mips64el(s,pTVar2,ret_00,arg2);
    goto switchD_009937cf_caseD_39;
  case 0x3f:
    pTVar2 = s->cpu_gpr[rt];
    arg2 = arg2 + 0x20;
LAB_009938aa:
    tcg_gen_sari_i64_mips64el(s,pTVar2,ret_00,arg2);
    goto switchD_009937cf_caseD_39;
  }
  tcg_gen_shli_i64_mips64el(s,pTVar2,ret_00,arg2);
switchD_009937cf_caseD_39:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_00 + (long)s));
  return;
}

Assistant:

static void gen_shift_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = ((uint16_t)imm) & 0x1f;
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLL:
        tcg_gen_shli_tl(tcg_ctx, t0, t0, uimm);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        break;
    case OPC_SRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SRL:
        if (uimm != 0) {
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_ROTR:
        if (uimm != 0) {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
            tcg_gen_rotri_i32(tcg_ctx, t1, t1, uimm);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t1);
            tcg_temp_free_i32(tcg_ctx, t1);
        } else {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLL:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRA:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DSRL:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_DROTR:
        if (uimm != 0) {
            tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm);
        } else {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0);
        }
        break;
    case OPC_DSLL32:
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRA32:
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DSRL32:
        tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
    case OPC_DROTR32:
        tcg_gen_rotri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, uimm + 32);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}